

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk_draw_list_command_last(nk_draw_list *list)

{
  void *pvVar1;
  nk_size nVar2;
  nk_draw_command *cmd;
  nk_size size;
  void *memory;
  nk_draw_list *list_local;
  
  if (list->cmd_count != 0) {
    pvVar1 = nk_buffer_memory(list->buffer);
    nVar2 = nk_buffer_total(list->buffer);
    return (nk_draw_command *)
           ((long)pvVar1 + (ulong)(list->cmd_count - 1) * -0x20 + (nVar2 - list->cmd_offset));
  }
  __assert_fail("list->cmd_count",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1f06,"struct nk_draw_command *nk_draw_list_command_last(struct nk_draw_list *)");
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_command_last(struct nk_draw_list *list)
{
    void *memory;
    nk_size size;
    struct nk_draw_command *cmd;
    NK_ASSERT(list->cmd_count);

    memory = nk_buffer_memory(list->buffer);
    size = nk_buffer_total(list->buffer);
    cmd = nk_ptr_add(struct nk_draw_command, memory, size - list->cmd_offset);
    return (cmd - (list->cmd_count-1));
}